

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::get_complexity_per_elem_tmpl<3,1>(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint ent_dim;
  Alloc *pAVar3;
  LO LVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  Reals RVar6;
  Write<double> out_w;
  type f;
  Reals elem_metrics;
  Reals coords;
  LOs elems2verts;
  Write<double> local_c8;
  type local_b8;
  Write<double> local_78;
  Reals local_68;
  Alloc *local_58;
  void *local_50;
  Alloc *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *local_30;
  
  Mesh::ask_elem_verts((Mesh *)&local_38);
  Mesh::coords((Mesh *)&local_48);
  LVar4 = Mesh::nelems(mesh);
  local_b8.elems2verts.write_.shared_alloc_.alloc = (Alloc *)&local_b8.coords;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  Write<double>::Write(&local_c8,LVar4,(string *)&local_b8);
  if (local_b8.elems2verts.write_.shared_alloc_.alloc != (Alloc *)&local_b8.coords) {
    operator_delete(local_b8.elems2verts.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_b8.coords.write_.shared_alloc_.alloc)->size + 1));
  }
  ent_dim = mesh->dim_;
  if (ent_dim < 4) {
    local_68.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
    get_mident_metrics((Omega_h *)&local_58,mesh,ent_dim,&local_68,false);
    pAVar3 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    local_b8.elems2verts.write_.shared_alloc_.alloc = (Alloc *)local_38._M_pi;
    if (((ulong)local_38._M_pi & 7) == 0 && (Alloc *)local_38._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.elems2verts.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_38._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_38._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_38._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_b8.elems2verts.write_.shared_alloc_.direct_ptr = local_30;
    local_b8.coords.write_.shared_alloc_.alloc = local_48;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.coords.write_.shared_alloc_.alloc = (Alloc *)(local_48->size * 8 + 1);
      }
      else {
        local_48->use_count = local_48->use_count + 1;
      }
    }
    local_b8.coords.write_.shared_alloc_.direct_ptr = local_40;
    local_b8.elem_metrics.write_.shared_alloc_.alloc = local_58;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.elem_metrics.write_.shared_alloc_.alloc = (Alloc *)(local_58->size * 8 + 1);
      }
      else {
        local_58->use_count = local_58->use_count + 1;
      }
    }
    local_b8.elem_metrics.write_.shared_alloc_.direct_ptr = local_50;
    local_b8.out_w.shared_alloc_.alloc = local_c8.shared_alloc_.alloc;
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.out_w.shared_alloc_.alloc = (Alloc *)((local_c8.shared_alloc_.alloc)->size * 8 + 1)
        ;
      }
      else {
        (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.out_w.shared_alloc_.direct_ptr = local_c8.shared_alloc_.direct_ptr;
    LVar4 = Mesh::nelems(mesh);
    parallel_for<Omega_h::get_complexity_per_elem_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<double>)::_lambda(int)_1_>
              (LVar4,&local_b8);
    local_78.shared_alloc_.alloc = local_c8.shared_alloc_.alloc;
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.shared_alloc_.alloc = (Alloc *)((local_c8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_c8.shared_alloc_.alloc)->use_count = (local_c8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.shared_alloc_.direct_ptr = local_c8.shared_alloc_.direct_ptr;
    Read<double>::Read((Read<signed_char> *)this,&local_78);
    pAVar3 = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    get_complexity_per_elem_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<double>)::{lambda(int)#1}::~Mesh
              ((_lambda_int__1_ *)&local_b8);
    pvVar5 = extraout_RDX;
    if (((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) {
      piVar1 = &local_58->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_58);
        operator_delete(local_58,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.shared_alloc_.alloc);
        operator_delete(local_c8.shared_alloc_.alloc,0x48);
        pvVar5 = extraout_RDX_01;
      }
    }
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      piVar1 = &local_48->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48);
        operator_delete(local_48,0x48);
        pvVar5 = extraout_RDX_02;
      }
    }
    if (((ulong)local_38._M_pi & 7) == 0 && (Alloc *)local_38._M_pi != (Alloc *)0x0) {
      p_Var2 = local_38._M_pi + 3;
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_38._M_pi);
        operator_delete(local_38._M_pi,0x48);
        pvVar5 = extraout_RDX_03;
      }
    }
    RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Reals get_complexity_per_elem_tmpl(Mesh* mesh, Reals v2m) {
  auto const elems2verts = mesh->ask_elem_verts();
  auto const coords = mesh->coords();
  auto const out_w = Write<Real>(mesh->nelems());
  auto const elem_metrics = get_mident_metrics(mesh, mesh->dim(), v2m);
  auto f = OMEGA_H_LAMBDA(LO const e) {
    auto const v = gather_verts<mesh_dim + 1>(elems2verts, e);
    auto const p = gather_vectors<mesh_dim + 1, mesh_dim>(coords, v);
    auto const b = simplex_basis<mesh_dim, mesh_dim>(p);
    auto const real_volume = simplex_size_from_basis(b);
    auto const m = get_symm<metric_dim>(elem_metrics, e);
    auto const sqrt_metric_det =
        power<mesh_dim, 2 * metric_dim>(determinant(m));
    out_w[e] = real_volume * sqrt_metric_det;
  };
  parallel_for(mesh->nelems(), std::move(f));
  return Reals(out_w);
}